

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapValueRef::SetFloatValue(MapValueRef *this,float value)

{
  CppType CVar1;
  LogMessage *pLVar2;
  char *local_48;
  char *local_40 [3];
  LogMessageFatal local_28 [19];
  Voidify local_15;
  float local_14;
  MapValueRef *pMStack_10;
  float value_local;
  MapValueRef *this_local;
  
  local_14 = value;
  pMStack_10 = this;
  CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
  if (CVar1 != CPPTYPE_FLOAT) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/map_field.h"
               ,0x35f);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [34])"Protocol Buffer map usage error:\n");
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [27])"MapValueRef::SetFloatValue");
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [22])" type does not match\n");
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [14])"  Expected : ");
    local_40[0] = FieldDescriptor::CppTypeName(CPPTYPE_FLOAT);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
                       (pLVar2,local_40);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(char (*) [2])0x603aea)
    ;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [14])"  Actual   : ");
    CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
    local_48 = FieldDescriptor::CppTypeName(CVar1);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
                       (pLVar2,&local_48);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_15,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
  }
  *(float *)(this->super_MapValueConstRef).data_ = local_14;
  return;
}

Assistant:

void SetFloatValue(float value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_FLOAT, "MapValueRef::SetFloatValue");
    *reinterpret_cast<float*>(data_) = value;
  }